

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::InitScreen
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_1)

{
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_0_local;
  
  initscr();
  BasicValue::BasicValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::InitScreen(std::list<BasicValue> &/*Args*/) {
  ::initscr();
  return BasicValue();
}